

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t zipx_xz_init(archive_read *a,zip *zip)

{
  uint uVar1;
  uchar *puVar2;
  lzma_ret r;
  zip *zip_local;
  archive_read *a_local;
  
  if (zip->zipx_lzma_valid != '\0') {
    lzma_end(&zip->zipx_lzma_stream);
    zip->zipx_lzma_valid = '\0';
  }
  memset(&zip->zipx_lzma_stream,0,0x88);
  uVar1 = lzma_stream_decoder(&zip->zipx_lzma_stream,0xffffffffffffffff,0);
  if (uVar1 == 0) {
    zip->zipx_lzma_valid = '\x01';
    free(zip->uncompressed_buffer);
    zip->uncompressed_buffer_size = 0x40000;
    puVar2 = (uchar *)malloc(zip->uncompressed_buffer_size);
    zip->uncompressed_buffer = puVar2;
    if (zip->uncompressed_buffer == (uchar *)0x0) {
      archive_set_error(&a->archive,0xc,"No memory for xz decompression");
      a_local._4_4_ = L'\xffffffe2';
    }
    else {
      zip->decompress_init = '\x01';
      a_local._4_4_ = L'\0';
    }
  }
  else {
    archive_set_error(&a->archive,-1,"xz initialization failed(%d)",(ulong)uVar1);
    a_local._4_4_ = L'\xffffffe7';
  }
  return a_local._4_4_;
}

Assistant:

static int
zipx_xz_init(struct archive_read *a, struct zip *zip)
{
	lzma_ret r;

	if(zip->zipx_lzma_valid) {
		lzma_end(&zip->zipx_lzma_stream);
		zip->zipx_lzma_valid = 0;
	}

	memset(&zip->zipx_lzma_stream, 0, sizeof(zip->zipx_lzma_stream));
	r = lzma_stream_decoder(&zip->zipx_lzma_stream, UINT64_MAX, 0);
	if (r != LZMA_OK) {
		archive_set_error(&(a->archive), ARCHIVE_ERRNO_MISC,
		    "xz initialization failed(%d)",
		    r);

		return (ARCHIVE_FAILED);
	}

	zip->zipx_lzma_valid = 1;

	free(zip->uncompressed_buffer);

	zip->uncompressed_buffer_size = 256 * 1024;
	zip->uncompressed_buffer = malloc(zip->uncompressed_buffer_size);
	if (zip->uncompressed_buffer == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "No memory for xz decompression");
		    return (ARCHIVE_FATAL);
	}

	zip->decompress_init = 1;
	return (ARCHIVE_OK);
}